

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O3

Int128 * helper_atomic_cmpxchgo_le_mmu_mips64
                   (Int128 *__return_storage_ptr__,CPUArchState_conflict11 *env,target_ulong addr,
                   Int128 cmpv,Int128 newv,TCGMemOpIdx oi,uintptr_t retaddr)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  undefined4 in_register_0000000c;
  undefined8 in_R9;
  
  auVar1._12_4_ = in_register_0000000c;
  auVar1._8_4_ = oi;
  pauVar2 = (undefined1 (*) [16])
            atomic_mmu_lookup((CPUArchState_conflict11 *)__return_storage_ptr__,(target_ulong)env,
                              (TCGMemOpIdx)cmpv,cmpv._8_8_);
  LOCK();
  auVar1._0_8_ = addr;
  if (auVar1 == *pauVar2) {
    *(uintptr_t *)*pauVar2 = retaddr;
    *(undefined8 *)(*pauVar2 + 8) = in_R9;
  }
  else {
    addr = SUB168(*pauVar2,0);
  }
  UNLOCK();
  return (Int128 *)addr;
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;

#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, cmpv, newv);
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, cmpv, newv);
#else
    ret = atomic_cmpxchg__nocheck(haddr, cmpv, newv);
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return ret;
}